

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.cpp
# Opt level: O1

void __thiscall ScopeNode::ScopeNode(ScopeNode *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>_>
  _Stack_58;
  undefined4 local_28;
  undefined8 local_20;
  undefined8 *******local_18;
  undefined8 *******local_10;
  undefined8 local_8;
  
  p_Var1 = &(this->symbols_)._M_t._M_impl.super__Rb_tree_header;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->enclosing_scope_ = (ScopeNode *)0x0;
  (this->children_).super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->children_;
  (this->children_).super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->children_;
  (this->children_).super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  _M_size = 0;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_58._M_impl.super__Rb_tree_header._M_header;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_20 = 0;
  local_18 = &local_18;
  local_8 = 0;
  local_28 = 0;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
  local_10 = local_18;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>_>
  ::~_Rb_tree(&_Stack_58);
  return;
}

Assistant:

ScopeNode::ScopeNode() : enclosing_scope_(nullptr) {
    ScopeNode(nullptr);
}